

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

MOJOSHADER_parseData * build_parsedata(Context *ctx)

{
  int iVar1;
  ConstantsList *pCVar2;
  VariableList *pVVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined8 uVar6;
  undefined1 auVar7 [13];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  MOJOSHADER_parseData *__s;
  MOJOSHADER_constant *pMVar11;
  ConstantsList **ppCVar12;
  char *pcVar13;
  MOJOSHADER_error *pMVar14;
  MOJOSHADER_swizzle *__dest;
  ulong uVar15;
  MOJOSHADER_attribute *__s_00;
  MOJOSHADER_attribute *__s_01;
  MOJOSHADER_attribute *pMVar16;
  int iVar17;
  MOJOSHADER_constant *pMVar18;
  int iVar19;
  long lVar20;
  RegisterType RVar21;
  MOJOSHADER_uniformType MVar22;
  RegisterList *pRVar23;
  int *piVar24;
  size_t sVar25;
  ulong uVar26;
  char **ppcVar27;
  MOJOSHADER_uniform *pMVar28;
  VariableList **ppVVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  MOJOSHADER_sampler *local_d8;
  MOJOSHADER_uniform *local_b8;
  MOJOSHADER_attribute *local_b0;
  char *local_a0;
  size_t output_len;
  Buffer *local_88;
  Buffer *pBStack_80;
  Buffer *local_78;
  Buffer *pBStack_70;
  Buffer *local_68;
  Buffer *pBStack_60;
  Buffer *local_58;
  Buffer *pBStack_50;
  Buffer *local_48;
  Buffer *pBStack_40;
  Buffer *local_38;
  
  output_len = 0;
  if ((ctx->out_of_memory != 0) ||
     (__s = (MOJOSHADER_parseData *)Malloc(ctx,0xd0), __s == (MOJOSHADER_parseData *)0x0)) {
    return &MOJOSHADER_out_of_mem_data;
  }
  memset(__s,0,0xd0);
  if (ctx->isfail == 0) {
    local_88 = ctx->preflight;
    pBStack_80 = ctx->globals;
    local_78 = ctx->inputs;
    pBStack_70 = ctx->outputs;
    local_68 = ctx->helpers;
    pBStack_60 = ctx->subroutines;
    local_58 = ctx->mainline_intro;
    pBStack_50 = ctx->mainline_arguments;
    local_48 = ctx->mainline_top;
    pBStack_40 = ctx->mainline;
    local_38 = ctx->postflight;
    local_a0 = buffer_merge(&local_88,0xb,&output_len);
    if (ctx->isfail != 0) {
      pMVar11 = (MOJOSHADER_constant *)0x0;
      goto LAB_0010a7fc;
    }
    pMVar11 = (MOJOSHADER_constant *)Malloc(ctx,(long)ctx->constant_count * 0x18);
    if (pMVar11 != (MOJOSHADER_constant *)0x0) {
      ppCVar12 = &ctx->constants;
      pMVar18 = pMVar11;
      for (lVar20 = 0; lVar20 < ctx->constant_count; lVar20 = lVar20 + 1) {
        pCVar2 = *ppCVar12;
        if (pCVar2 == (ConstantsList *)0x0) {
          fail(ctx,"BUG: mismatched constant list and count");
          break;
        }
        *(undefined8 *)((long)&pMVar18->value + 8) =
             *(undefined8 *)((long)&(pCVar2->constant).value + 8);
        iVar19 = (pCVar2->constant).index;
        uVar6 = *(undefined8 *)&(pCVar2->constant).value;
        pMVar18->type = (pCVar2->constant).type;
        pMVar18->index = iVar19;
        *(undefined8 *)&pMVar18->value = uVar6;
        ppCVar12 = &pCVar2->next;
        pMVar18 = pMVar18 + 1;
      }
    }
    if (ctx->isfail != 0) goto LAB_0010a7fc;
    sVar25 = (long)ctx->uniform_count * 0x18;
    local_b8 = (MOJOSHADER_uniform *)Malloc(ctx,sVar25);
    if (local_b8 != (MOJOSHADER_uniform *)0x0) {
      iVar19 = 0;
      memset(local_b8,0,sVar25);
      ppVVar29 = &ctx->variables;
      pMVar28 = local_b8;
      while (pVVar3 = *ppVVar29, pVVar3 != (VariableList *)0x0) {
        if ((pVVar3->used != 0) &&
           (pcVar13 = (*ctx->profile->get_const_array_varname)(ctx,pVVar3->index,pVVar3->count),
           pcVar13 != (char *)0x0)) {
          pMVar28->type = MOJOSHADER_UNIFORM_FLOAT;
          iVar1 = pVVar3->count;
          pMVar28->index = pVVar3->index;
          pMVar28->array_count = iVar1;
          pMVar28->constant = (uint)(pVVar3->constant != (ConstantsList *)0x0);
          pMVar28->name = pcVar13;
          pMVar28 = pMVar28 + 1;
          iVar19 = iVar19 + 1;
        }
        ppVVar29 = &pVVar3->next;
      }
      pRVar23 = &ctx->uniforms;
      MVar22 = MOJOSHADER_UNIFORM_FLOAT;
LAB_0010ac9f:
      if (iVar19 < ctx->uniform_count) {
        pRVar23 = pRVar23->next;
        if (pRVar23 != (RegisterList *)0x0) {
          RVar21 = pRVar23->regtype;
          iVar1 = pRVar23->regnum;
          iVar17 = iVar1;
          if (RVar21 == REG_TYPE_CONST) goto LAB_0010acdc;
          if (RVar21 == REG_TYPE_CONSTINT) {
            MVar22 = MOJOSHADER_UNIFORM_INT;
          }
          else if (RVar21 == REG_TYPE_CONSTBOOL) {
            MVar22 = MOJOSHADER_UNIFORM_BOOL;
          }
          else {
            fail(ctx,"unknown uniform datatype");
            RVar21 = pRVar23->regtype;
            iVar17 = pRVar23->regnum;
          }
          goto LAB_0010ad07;
        }
        fail(ctx,"BUG: mismatched uniform list and count");
      }
    }
    if (ctx->isfail == 0) {
      if ((long)ctx->attribute_count == 0) {
LAB_0010ae9c:
        uVar9 = 0;
        __s_00 = (MOJOSHADER_attribute *)0x0;
      }
      else {
        sVar25 = (long)ctx->attribute_count << 4;
        __s_00 = (MOJOSHADER_attribute *)Malloc(ctx,sVar25);
        if (__s_00 == (MOJOSHADER_attribute *)0x0) goto LAB_0010ae9c;
        pRVar23 = (ctx->attributes).next;
        uVar9 = 0;
        memset(__s_00,0,sVar25);
        local_b0 = __s_00;
        for (iVar19 = 0; iVar19 < ctx->attribute_count; iVar19 = iVar19 + 1) {
          if (pRVar23 == (RegisterList *)0x0) {
            fail(ctx,"BUG: mismatched attribute list and count");
            break;
          }
          RVar21 = pRVar23->regtype;
          if (RVar21 < REG_TYPE_LABEL) {
            if ((0x370U >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0) {
              if ((0x2000aU >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)
              goto LAB_0010ae19;
              if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) goto LAB_0010ae87;
              goto LAB_0010ae3c;
            }
          }
          else {
LAB_0010ae19:
            if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
              fail(ctx,"BUG: pixel shader with vertex attributes");
            }
            else {
LAB_0010ae3c:
              uVar10 = pRVar23->index;
              local_b0->usage = pRVar23->usage;
              local_b0->index = uVar10;
              pcVar13 = (*ctx->profile->get_varname)(ctx,RVar21,pRVar23->regnum);
              local_b0->name = pcVar13;
              local_b0 = local_b0 + 1;
              uVar9 = uVar9 + 1;
            }
          }
LAB_0010ae87:
          pRVar23 = pRVar23->next;
        }
      }
      if ((ctx->isfail == 0) && ((long)ctx->attribute_count != 0)) {
        sVar25 = (long)ctx->attribute_count << 4;
        __s_01 = (MOJOSHADER_attribute *)Malloc(ctx,sVar25);
        if (__s_01 == (MOJOSHADER_attribute *)0x0) {
          uVar10 = 0;
          __s_01 = (MOJOSHADER_attribute *)0x0;
        }
        else {
          pRVar23 = (ctx->attributes).next;
          uVar10 = 0;
          memset(__s_01,0,sVar25);
          pMVar16 = __s_01;
          for (iVar19 = 0; iVar19 < ctx->attribute_count; iVar19 = iVar19 + 1) {
            if (pRVar23 == (RegisterList *)0x0) {
              fail(ctx,"BUG: mismatched attribute list and count");
              break;
            }
            RVar21 = pRVar23->regtype;
            if ((RVar21 < REG_TYPE_SAMPLER) &&
               ((0x370U >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) != 0)) {
              uVar8 = pRVar23->index;
              pMVar16->usage = pRVar23->usage;
              pMVar16->index = uVar8;
              pcVar13 = (*ctx->profile->get_varname)(ctx,RVar21,pRVar23->regnum);
              pMVar16->name = pcVar13;
              pMVar16 = pMVar16 + 1;
              uVar10 = uVar10 + 1;
            }
            pRVar23 = pRVar23->next;
          }
        }
        goto LAB_0010a811;
      }
      goto LAB_0010a80e;
    }
    __s_00 = (MOJOSHADER_attribute *)0x0;
    uVar9 = 0;
    uVar10 = 0;
    __s_01 = (MOJOSHADER_attribute *)0x0;
  }
  else {
    pMVar11 = (MOJOSHADER_constant *)0x0;
    local_a0 = (char *)0x0;
LAB_0010a7fc:
    uVar9 = 0;
    __s_00 = (MOJOSHADER_attribute *)0x0;
    local_b8 = (MOJOSHADER_uniform *)0x0;
LAB_0010a80e:
    uVar10 = 0;
    __s_01 = (MOJOSHADER_attribute *)0x0;
  }
LAB_0010a811:
  if (ctx->isfail == 0) {
    sVar25 = (long)ctx->sampler_count * 0x18;
    local_d8 = (MOJOSHADER_sampler *)Malloc(ctx,sVar25);
    if (local_d8 == (MOJOSHADER_sampler *)0x0) goto LAB_0010a81b;
    pRVar23 = (ctx->samplers).next;
    memset(local_d8,0,sVar25);
    piVar24 = &local_d8->texbem;
    for (lVar20 = 0; lVar20 < ctx->sampler_count; lVar20 = lVar20 + 1) {
      if (pRVar23 == (RegisterList *)0x0) {
        fail(ctx,"BUG: mismatched sampler list and count");
        break;
      }
      if (pRVar23->regtype != REG_TYPE_SAMPLER) {
        __assert_fail("item->regtype == REG_TYPE_SAMPLER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x2cce,"MOJOSHADER_sampler *build_samplers(Context *)");
      }
      ((MOJOSHADER_sampler *)(piVar24 + -4))->type = pRVar23->index + ~MOJOSHADER_SAMPLER_CUBE;
      uVar8 = pRVar23->regnum;
      piVar24[-3] = uVar8;
      pcVar13 = (*ctx->profile->get_varname)(ctx,REG_TYPE_SAMPLER,uVar8);
      *(char **)(piVar24 + -2) = pcVar13;
      *piVar24 = (uint)(pRVar23->misc != 0);
      pRVar23 = pRVar23->next;
      piVar24 = piVar24 + 6;
    }
  }
  else {
LAB_0010a81b:
    local_d8 = (MOJOSHADER_sampler *)0x0;
  }
  uVar8 = errorlist_count(ctx->errors);
  pMVar14 = errorlist_flatten(ctx->errors);
  if (ctx->isfail == 0) {
    if (ctx->swizzles_count == 0) {
LAB_0010a932:
      __dest = (MOJOSHADER_swizzle *)0x0;
    }
    else {
      sVar25 = (size_t)(int)(ctx->swizzles_count * 0xc);
      __dest = (MOJOSHADER_swizzle *)Malloc(ctx,sVar25);
      if (__dest == (MOJOSHADER_swizzle *)0x0) goto LAB_0010a932;
      memcpy(__dest,ctx->swizzles,sVar25);
    }
    if (ctx->isfail == 0) {
      __s->profile = ctx->profile->name;
      __s->output = local_a0;
      __s->output_len = (int)output_len;
      __s->instruction_count = ctx->instruction_count;
      __s->shader_type = ctx->shader_type;
      uVar30._0_1_ = ctx->major_ver;
      uVar30._1_1_ = ctx->minor_ver;
      uVar30._2_2_ = *(undefined2 *)&ctx->field_0x126;
      auVar4[0xc] = (char)((ushort)uVar30._2_2_ >> 8);
      auVar4._0_12_ = ZEXT712(0);
      auVar7[1] = 0;
      auVar7[0] = (byte)uVar30._2_2_;
      auVar7._2_3_ = auVar4._10_3_;
      auVar7._5_8_ = 0;
      auVar5[5] = 0;
      auVar5[4] = uVar30._1_1_;
      auVar5._6_7_ = SUB137(auVar7 << 0x40,6);
      auVar5._0_4_ = uVar30 & 0xff;
      __s->major_ver = (int)auVar5._0_8_;
      __s->minor_ver = (int)((ulong)auVar5._0_8_ >> 0x20);
      __s->uniform_count = ctx->uniform_count;
      __s->uniforms = local_b8;
      __s->constant_count = ctx->constant_count;
      __s->constants = pMVar11;
      __s->sampler_count = ctx->sampler_count;
      __s->samplers = local_d8;
      __s->attribute_count = uVar9;
      __s->attributes = __s_00;
      __s->output_count = uVar10;
      __s->outputs = __s_01;
      __s->swizzle_count = ctx->swizzles_count;
      __s->swizzles = __dest;
      __s->symbol_count = (ctx->ctab).symbol_count;
      __s->symbols = (ctx->ctab).symbols;
      __s->preshader = ctx->preshader;
      __s->mainfn = ctx->mainfn;
      (ctx->ctab).symbols = (MOJOSHADER_symbol *)0x0;
      ctx->preshader = (MOJOSHADER_preshader *)0x0;
      (ctx->ctab).symbol_count = 0;
      ctx->mainfn = (char *)0x0;
      goto LAB_0010abb0;
    }
  }
  else {
    __dest = (MOJOSHADER_swizzle *)0x0;
  }
  (*ctx->free)(local_a0,ctx->malloc_data);
  (*ctx->free)(pMVar11,ctx->malloc_data);
  (*ctx->free)(__dest,ctx->malloc_data);
  if (local_b8 != (MOJOSHADER_uniform *)0x0) {
    ppcVar27 = &local_b8->name;
    for (lVar20 = 0; lVar20 < ctx->uniform_count; lVar20 = lVar20 + 1) {
      (*ctx->free)(*ppcVar27,ctx->malloc_data);
      ppcVar27 = ppcVar27 + 3;
    }
    (*ctx->free)(local_b8,ctx->malloc_data);
  }
  if (__s_00 != (MOJOSHADER_attribute *)0x0) {
    uVar26 = 0;
    uVar15 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar15 = uVar26;
    }
    for (; uVar15 * 0x10 != uVar26; uVar26 = uVar26 + 0x10) {
      (*ctx->free)(*(void **)((long)&__s_00->name + uVar26),ctx->malloc_data);
    }
    (*ctx->free)(__s_00,ctx->malloc_data);
  }
  if (__s_01 != (MOJOSHADER_attribute *)0x0) {
    uVar26 = 0;
    uVar15 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar15 = uVar26;
    }
    for (; uVar15 * 0x10 != uVar26; uVar26 = uVar26 + 0x10) {
      (*ctx->free)(*(void **)((long)&__s_01->name + uVar26),ctx->malloc_data);
    }
    (*ctx->free)(__s_01,ctx->malloc_data);
  }
  if (local_d8 != (MOJOSHADER_sampler *)0x0) {
    ppcVar27 = &local_d8->name;
    for (lVar20 = 0; lVar20 < ctx->sampler_count; lVar20 = lVar20 + 1) {
      (*ctx->free)(*ppcVar27,ctx->malloc_data);
      ppcVar27 = ppcVar27 + 3;
    }
    (*ctx->free)(local_d8,ctx->malloc_data);
  }
  if (ctx->out_of_memory != 0) {
    uVar26 = 0;
    uVar15 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar15 = uVar26;
    }
    for (; uVar15 * 0x18 - uVar26 != 0; uVar26 = uVar26 + 0x18) {
      (*ctx->free)(*(void **)((long)&pMVar14->filename + uVar26),ctx->malloc_data);
      (*ctx->free)(*(void **)((long)&pMVar14->error + uVar26),ctx->malloc_data);
    }
    (*ctx->free)(pMVar14,ctx->malloc_data);
    (*ctx->free)(__s,ctx->malloc_data);
    return &MOJOSHADER_out_of_mem_data;
  }
LAB_0010abb0:
  __s->error_count = uVar8;
  __s->errors = pMVar14;
  uVar9 = *(uint *)((long)&ctx->malloc + 4);
  uVar10 = *(uint *)&ctx->free;
  uVar8 = *(uint *)((long)&ctx->free + 4);
  uVar30 = -(uint)(*(uint *)&ctx->malloc == 0x11c154);
  uVar31 = -(uint)(uVar9 == 0);
  uVar32 = -(uint)(uVar10 == 0x11c15c);
  uVar33 = -(uint)(uVar8 == 0);
  *(uint *)&__s->malloc = ~(uVar31 & uVar30) & *(uint *)&ctx->malloc;
  *(uint *)((long)&__s->malloc + 4) = ~(uVar30 & uVar31) & uVar9;
  *(uint *)&__s->free = ~(uVar33 & uVar32) & uVar10;
  *(uint *)((long)&__s->free + 4) = ~(uVar32 & uVar33) & uVar8;
  __s->malloc_data = ctx->malloc_data;
  return __s;
LAB_0010acdc:
  MVar22 = MOJOSHADER_UNIFORM_FLOAT;
  RVar21 = REG_TYPE_CONST;
  if (pRVar23->array == (VariableList *)0x0) {
LAB_0010ad07:
    pMVar28->type = MVar22;
    pMVar28->index = iVar1;
    pMVar28->array_count = 0;
    pcVar13 = (*ctx->profile->get_varname)(ctx,RVar21,iVar17);
    pMVar28->name = pcVar13;
    pMVar28 = pMVar28 + 1;
    iVar19 = iVar19 + 1;
  }
  goto LAB_0010ac9f;
}

Assistant:

static MOJOSHADER_parseData *build_parsedata(Context *ctx)
{
    char *output = NULL;
    MOJOSHADER_constant *constants = NULL;
    MOJOSHADER_uniform *uniforms = NULL;
    MOJOSHADER_attribute *attributes = NULL;
    MOJOSHADER_attribute *outputs = NULL;
    MOJOSHADER_sampler *samplers = NULL;
    MOJOSHADER_swizzle *swizzles = NULL;
    MOJOSHADER_error *errors = NULL;
    MOJOSHADER_parseData *retval = NULL;
    size_t output_len = 0;
    int attribute_count = 0;
    int output_count = 0;

    if (ctx->out_of_memory)
        return &MOJOSHADER_out_of_mem_data;

    retval = (MOJOSHADER_parseData*) Malloc(ctx, sizeof(MOJOSHADER_parseData));
    if (retval == NULL)
        return &MOJOSHADER_out_of_mem_data;

    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    if (!isfail(ctx))
        output = build_output(ctx, &output_len);

    if (!isfail(ctx))
        constants = build_constants(ctx);

    if (!isfail(ctx))
        uniforms = build_uniforms(ctx);

    if (!isfail(ctx))
        attributes = build_attributes(ctx, &attribute_count);

    if (!isfail(ctx))
        outputs = build_outputs(ctx, &output_count);

    if (!isfail(ctx))
        samplers = build_samplers(ctx);

    const int error_count = errorlist_count(ctx->errors);
    errors = errorlist_flatten(ctx->errors);

    if (!isfail(ctx))
    {
        if (ctx->swizzles_count > 0)
        {
            const int len = ctx->swizzles_count * sizeof (MOJOSHADER_swizzle);
            swizzles = (MOJOSHADER_swizzle *) Malloc(ctx, len);
            if (swizzles != NULL)
                memcpy(swizzles, ctx->swizzles, len);
        } // if
    } // if

    // check again, in case build_output, etc, ran out of memory.
    if (isfail(ctx))
    {
        int i;

        Free(ctx, output);
        Free(ctx, constants);
        Free(ctx, swizzles);

        if (uniforms != NULL)
        {
            for (i = 0; i < ctx->uniform_count; i++)
                Free(ctx, (void *) uniforms[i].name);
            Free(ctx, uniforms);
        } // if

        if (attributes != NULL)
        {
            for (i = 0; i < attribute_count; i++)
                Free(ctx, (void *) attributes[i].name);
            Free(ctx, attributes);
        } // if

        if (outputs != NULL)
        {
            for (i = 0; i < output_count; i++)
                Free(ctx, (void *) outputs[i].name);
            Free(ctx, outputs);
        } // if

        if (samplers != NULL)
        {
            for (i = 0; i < ctx->sampler_count; i++)
                Free(ctx, (void *) samplers[i].name);
            Free(ctx, samplers);
        } // if

        if (ctx->out_of_memory)
        {
            for (i = 0; i < error_count; i++)
            {
                Free(ctx, (void *) errors[i].filename);
                Free(ctx, (void *) errors[i].error);
            } // for
            Free(ctx, errors);
            Free(ctx, retval);
            return &MOJOSHADER_out_of_mem_data;
        } // if
    } // if
    else
    {
        retval->profile = ctx->profile->name;
        retval->output = output;
        retval->output_len = (int) output_len;
        retval->instruction_count = ctx->instruction_count;
        retval->shader_type = ctx->shader_type;
        retval->major_ver = (int) ctx->major_ver;
        retval->minor_ver = (int) ctx->minor_ver;
        retval->uniform_count = ctx->uniform_count;
        retval->uniforms = uniforms;
        retval->constant_count = ctx->constant_count;
        retval->constants = constants;
        retval->sampler_count = ctx->sampler_count;
        retval->samplers = samplers;
        retval->attribute_count = attribute_count;
        retval->attributes = attributes;
        retval->output_count = output_count;
        retval->outputs = outputs;
        retval->swizzle_count = ctx->swizzles_count;
        retval->swizzles = swizzles;
        retval->symbol_count = ctx->ctab.symbol_count;
        retval->symbols = ctx->ctab.symbols;
        retval->preshader = ctx->preshader;
        retval->mainfn = ctx->mainfn;

        // we don't own these now, retval does.
        ctx->ctab.symbols = NULL;
        ctx->preshader = NULL;
        ctx->ctab.symbol_count = 0;
        ctx->mainfn = NULL;
    } // else

    retval->error_count = error_count;
    retval->errors = errors;
    retval->malloc = (ctx->malloc == MOJOSHADER_internal_malloc) ? NULL : ctx->malloc;
    retval->free = (ctx->free == MOJOSHADER_internal_free) ? NULL : ctx->free;
    retval->malloc_data = ctx->malloc_data;

    return retval;
}